

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O1

void __thiscall ClassBundle::updateFieldType(ClassBundle *this,FieldType *type)

{
  pointer pFVar1;
  pointer pcVar2;
  pointer pCVar3;
  pointer pbVar4;
  int iVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  pointer pCVar8;
  pointer pbVar9;
  FieldType *itr;
  pointer type_00;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> builtinClass;
  string cleanType;
  string remainingType;
  Field onlyBaseType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  FieldType *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Field local_70;
  
  pFVar1 = (type->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_b8 = type;
  for (type_00 = (type->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>.
                 _M_impl.super__Vector_impl_data._M_start; type_00 != pFVar1; type_00 = type_00 + 1)
  {
    updateFieldType(this,type_00);
  }
  Field::Field(&local_70);
  std::__cxx11::string::_M_assign((string *)&local_70);
  Field::onlyType_abi_cxx11_(&local_d8,&local_70);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
  pbVar4 = builtinClasses_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (builtinClasses_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      builtinClasses_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar9 = builtinClasses_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar9->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar2,pcVar2 + pbVar9->_M_string_length);
      if (local_d8._M_string_length == local_f8._M_string_length) {
        if (local_d8._M_string_length == 0) {
          bVar10 = true;
        }
        else {
          iVar5 = bcmp(local_d8._M_dataplus._M_p,local_f8._M_dataplus._M_p,local_d8._M_string_length
                      );
          bVar10 = iVar5 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (bVar10) goto LAB_0010a96f;
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar4);
  }
  pCVar3 = (this->allClasses).super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar8 = (this->allClasses).super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar8 != pCVar3; pCVar8 = pCVar8 + 1) {
    std::operator+(&local_f8,&pCVar8->scope,&pCVar8->name);
    iVar5 = 7;
    if (local_d8._M_string_length <= local_f8._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_f8);
      if (local_d8._M_string_length == local_b0._M_string_length) {
        if (local_d8._M_string_length == 0) {
          bVar10 = true;
        }
        else {
          iVar5 = bcmp(local_d8._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_d8._M_string_length
                      );
          bVar10 = iVar5 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      iVar5 = 0;
      if (bVar10) {
        std::operator+(&local_b0,&local_f8,&local_90);
        std::__cxx11::string::operator=((string *)local_b8,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        iVar5 = 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((iVar5 != 7) && (iVar5 != 0)) goto LAB_0010a96f;
  }
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->unknownClasses,&local_d8);
  if (*pmVar6 != 1) {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->unknownClasses,&local_d8);
    *pmVar6 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Warning]\t",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot determine full scope for class \"",0x27);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
  }
LAB_0010a96f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
    operator_delete(local_70.name._M_dataplus._M_p,local_70.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.type._M_dataplus._M_p != &local_70.type.field_2) {
    operator_delete(local_70.type._M_dataplus._M_p,local_70.type.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void updateFieldType(FieldType &type) {
        // solve childrens
        for (auto& itr : type.templateTypes) {
            updateFieldType(itr);
        }

        Field onlyBaseType;
        onlyBaseType.type = type.name;

        std::string cleanType = onlyBaseType.onlyType();
        std::string remainingType = onlyBaseType.type.substr(cleanType.size(), onlyBaseType.type.size());

        for (auto builtinClass : this->builtinClasses) {
            if (cleanType == builtinClass) {
                return;
            }
        }

        for (auto& targetClass : this->allClasses) {
            // check if classType ends with my type
            std::string classType = targetClass.scope + targetClass.name;

            if (classType.size() < cleanType.size()) {
                continue;
            }

            if (cleanType == classType.substr(classType.size() - cleanType.size(), cleanType.size())) {
                type.name = classType + remainingType;
                return;
            }
        }

        if (unknownClasses[cleanType] == 1) {
            return;
        }

        unknownClasses[cleanType] = 1;
        std::cerr << "[Warning]\t" << "Cannot determine full scope for class \"" << cleanType << "\"\n";

    }